

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O1

void pzshape::TPZShapePiram::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  long i;
  int64_t iVar4;
  ulong uVar5;
  ulong i_00;
  ulong j;
  ulong uVar6;
  TPZGenMatrix<int> locshapeorders;
  int local_50;
  TPZGenMatrix<int> local_48;
  
  uVar6 = 0;
  i = 0;
  do {
    iVar4 = 1;
    if (4 < uVar6) {
      iVar1 = NConnectShapeF((int)uVar6,order->fStore[uVar6 - 5]);
      iVar4 = (int64_t)iVar1;
    }
    iVar1 = 1;
    if (4 < uVar6) {
      iVar1 = order->fStore[uVar6 - 5];
    }
    TPZGenMatrix<int>::TPZGenMatrix(&local_48,iVar4,3);
    SideShapeOrder((int)uVar6,id,iVar1,&local_48);
    iVar4 = local_48.fCols;
    if (0 < (int)local_48.fRows) {
      i = (long)(int)i;
      uVar3 = local_48.fRows & 0x7fffffff;
      uVar5 = local_48.fCols & 0x7fffffff;
      i_00 = 0;
      do {
        local_50 = (int)iVar4;
        if (0 < local_50) {
          j = 0;
          do {
            piVar2 = TPZGenMatrix<int>::operator()(&local_48,i_00,j);
            iVar1 = *piVar2;
            piVar2 = TPZGenMatrix<int>::operator()(shapeorders,i,j);
            *piVar2 = iVar1;
            j = j + 1;
          } while (uVar5 != j);
        }
        i = i + 1;
        i_00 = i_00 + 1;
      } while (i_00 != uVar3);
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&local_48);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x13);
  return;
}

Assistant:

void TPZShapePiram::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        //DebugStop();
        int64_t nsides = TPZShapePiram::NSides;
        int nshape;
        
        int linha = 0;
        for (int side = 0; side < nsides; side++)
        {
            
            nshape = 1;
            if(side >= NCornerNodes) nshape = NConnectShapeF(side,order[side-NCornerNodes]);
            int sideorder = 1;
            if(side >= NCornerNodes) sideorder = order[side-NCornerNodes];
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            SideShapeOrder(side, id, sideorder, locshapeorders);
            
            int nlin = locshapeorders.Rows();
            int ncol = locshapeorders.Cols();
            
            for (int il = 0; il<nlin; il++)
            {
                for (int jc = 0; jc<ncol; jc++)
                {
                    shapeorders(linha, jc) = locshapeorders(il, jc);
                }
                linha++;
            }
        }
    }